

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::checkSpecialUnits(string *unit_string,uint64_t match_flags)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  const_reference pvVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  precise_unit bunit_3;
  precise_unit bunit_2;
  precise_unit bunit_1;
  precise_unit bunit;
  string ustring;
  string *in_stack_00000250;
  size_t fnd;
  uint64_t in_stack_00000c98;
  string *in_stack_00000ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  size_type in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  precise_unit *utest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  precise_unit *in_stack_fffffffffffffda0;
  undefined1 *in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  precise_unit local_198 [2];
  precise_unit local_178;
  precise_unit local_168;
  undefined1 local_158 [32];
  precise_unit local_138;
  precise_unit local_128;
  precise_unit local_f8;
  precise_unit local_c8;
  uint local_b4;
  precise_unit local_90;
  allocator<char> local_49 [33];
  size_t local_28;
  precise_unit local_10;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  sVar3 = findWordOperatorSep(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  std::__cxx11::string::~string(in_stack_fffffffffffffd80);
  std::allocator<char>::~allocator(local_49);
  local_28 = sVar3;
  if (sVar3 != 0xffffffffffffffff) {
    std::__cxx11::string::string(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (size_type)in_stack_fffffffffffffd80);
    std::__cxx11::string::string(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_90 = unit_from_string_internal(in_stack_00000ca0,in_stack_00000c98);
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    bVar1 = is_valid((precise_unit *)in_stack_fffffffffffffd90);
    if (bVar1) {
      local_10 = precise_unit::operator*
                           (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
    }
    local_b4 = (uint)bVar1;
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    if (local_b4 != 0) {
      return local_10;
    }
  }
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(in_stack_fffffffffffffdb0,(size_type)in_stack_fffffffffffffda8,
                  (size_type)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
  if (iVar2 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd98,(size_type)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    local_c8 = unit_from_string_internal(in_stack_00000ca0,in_stack_00000c98);
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    bVar1 = is_valid((precise_unit *)in_stack_fffffffffffffd90);
    if (bVar1) {
      pVar5 = precise_unit::operator*
                        (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
      return pVar5;
    }
  }
  pvVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           front(in_stack_fffffffffffffd80);
  pVar5._8_8_ = in_stack_fffffffffffffdb0;
  pVar5.multiplier_ = (double)in_stack_fffffffffffffdb8;
  if (*pvVar4 == '%') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd98,(size_type)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    local_f8 = default_unit(in_stack_00000250);
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    bVar1 = is_valid((precise_unit *)in_stack_fffffffffffffd90);
    if (bVar1) {
      local_128 = precise_unit::operator*
                            (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
      pVar5 = precise_unit::operator*
                        (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
      return pVar5;
    }
    in_stack_fffffffffffffda8 = local_158;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd98,(size_type)in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    pVar5 = unit_from_string_internal(in_stack_00000ca0,in_stack_00000c98);
    local_138 = pVar5;
    local_f8 = pVar5;
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    bVar1 = is_valid((precise_unit *)in_stack_fffffffffffffd90);
    if (bVar1) {
      local_168 = precise_unit::operator*
                            (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
      pVar5 = precise_unit::operator*
                        (in_stack_fffffffffffffda0,(precise_unit *)in_stack_fffffffffffffd98);
      return pVar5;
    }
  }
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(pVar5._8_8_,(size_type)in_stack_fffffffffffffda8,
                  (size_type)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98);
  if (iVar2 == 0) {
    utest = local_198;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_fffffffffffffd98,(size_type)utest,in_stack_fffffffffffffd88);
    pVar5 = default_unit(in_stack_00000250);
    local_178 = pVar5;
    std::__cxx11::string::~string(in_stack_fffffffffffffd80);
    bVar1 = is_valid(utest);
    if (bVar1) {
      pVar5 = precise_unit::operator*((precise_unit *)pVar5.multiplier_,(precise_unit *)pVar5._8_8_)
      ;
      return pVar5;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (pVar5._8_8_,(size_type)utest,in_stack_fffffffffffffd88);
    pVar6 = unit_from_string_internal(in_stack_00000ca0,in_stack_00000c98);
    local_178 = pVar6;
    std::__cxx11::string::~string(pVar6._8_8_);
    bVar1 = is_valid(utest);
    if (bVar1) {
      pVar5 = precise_unit::operator*((precise_unit *)pVar5.multiplier_,pVar5._8_8_);
      return pVar5;
    }
  }
  local_10.base_units_ = (unit_data)0xfa94a488;
  local_10.commodity_ = 0;
  local_10.multiplier_ = NAN;
  return local_10;
}

Assistant:

static precise_unit
    checkSpecialUnits(const std::string& unit_string, std::uint64_t match_flags)
{
    // lets try checking for meter next which is one of the most common
    // reasons for getting here
    auto fnd = findWordOperatorSep(unit_string, "meter");
    if (fnd != std::string::npos) {
        std::string ustring = unit_string;
        ustring.erase(fnd, 5);
        auto bunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(bunit)) {
            return precise::m * bunit;
        }
    }
    // detect another somewhat common situation often amphour or ampsecond
    if (unit_string.compare(0, 3, "amp") == 0) {
        auto bunit = unit_from_string_internal(
            unit_string.substr(3), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::A * bunit;
        }
    }
    if (unit_string.front() == '%') {
        auto bunit = default_unit(unit_string.substr(1));
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
        bunit = unit_from_string_internal(
            unit_string.substr(1), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
    }
    if (unit_string.compare(0, 2, "pu") == 0) {
        auto bunit = default_unit(unit_string.substr(2));
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
        bunit = unit_from_string_internal(
            unit_string.substr(2), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
    }
    return precise::invalid;
}